

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_benchmark.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other;
  double dVar2;
  double dVar3;
  numeric_type nVar4;
  double local_180;
  rt_expr<viennamath::rt_expression_interface<double>_> local_178;
  int local_16c;
  int i_2;
  expr e_opt;
  double local_140;
  type local_138;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_118;
  type local_100;
  type local_e0;
  type local_c0;
  rt_expr<viennamath::rt_expression_interface<double>_> local_a0;
  expr e;
  undefined1 local_88 [8];
  variable T;
  variable x;
  int i_1;
  int i;
  double mult;
  double eps;
  double prefactor;
  double voltage;
  double kb;
  double T_ref;
  double x_ref;
  double result;
  double elapsed;
  Timer timer;
  
  timer.ts._4_4_ = 0;
  Timer::Timer((Timer *)&elapsed);
  x_ref = 0.0;
  T_ref = 2.0;
  kb = 300.0;
  voltage = 1.61;
  prefactor = 3.0;
  eps = 2.0;
  mult = 8.854e-12;
  poVar1 = std::operator<<((ostream *)&std::cout,"**** ViennaMath performance benchmark ****");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Make sure that optimization flags (e.g. -O2) are set when benchmarking!"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Enter \'1\': ");
  std::istream::operator>>((istream *)&std::cin,(double *)&i_1);
  prefactor = _i_1 * prefactor;
  eps = _i_1 * eps;
  kb = _i_1 * kb;
  voltage = _i_1 * voltage;
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------- Naive (standard) implementation --------- ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Timer::start((Timer *)&elapsed);
  for (x.id_._4_4_ = 0; x.id_._4_4_ < 1000000; x.id_._4_4_ = x.id_._4_4_ + 1) {
    dVar2 = kb * mult * T_ref;
    dVar3 = exp((eps * prefactor) / (voltage * kb));
    x_ref = dVar2 * dVar3 + x_ref;
  }
  result = Timer::get((Timer *)&elapsed);
  print_stats(x_ref,result);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------- Hand tuned implementation (best possible, but will never be achieved within a simulator) --------- "
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  x_ref = 0.0;
  Timer::start((Timer *)&elapsed);
  for (x.id_._0_4_ = 0; (int)x.id_ < 1000000; x.id_._0_4_ = (int)x.id_ + 1) {
    x_ref = T_ref * 2.6894024e-09 + x_ref;
  }
  result = Timer::get((Timer *)&elapsed);
  print_stats(x_ref,result);
  poVar1 = std::operator<<((ostream *)&std::cout,"--------- ViennaMath (runtime) --------- ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::rt_variable
            ((rt_variable<viennamath::rt_expression_interface<double>_> *)&T.id_,0);
  viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::rt_variable
            ((rt_variable<viennamath::rt_expression_interface<double>_> *)local_88,1);
  viennamath::operator*
            (&local_100,(rt_variable<viennamath::rt_expression_interface<double>_> *)local_88,&mult)
  ;
  viennamath::operator*
            (&local_e0,&local_100,
             (rt_variable<viennamath::rt_expression_interface<double>_> *)&T.id_);
  local_140 = eps * prefactor;
  viennamath::operator*
            ((type *)&e_opt,&voltage,
             (rt_variable<viennamath::rt_expression_interface<double>_> *)local_88);
  viennamath::operator/
            (&local_138,&local_140,
             (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)&e_opt);
  viennamath::exp<viennamath::rt_expression_interface<double>>
            (&local_118,(viennamath *)&local_138,other);
  viennamath::operator*(&local_c0,&local_e0,&local_118);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_a0,&local_c0);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_c0);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
            (&local_118);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_138);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            ((rt_binary_expr<viennamath::rt_expression_interface<double>_> *)&e_opt);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_e0);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_100);
  poVar1 = std::operator<<((ostream *)&std::cout,"Expression before substitution: ");
  poVar1 = viennamath::operator<<(poVar1,&local_a0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::substitute<viennamath::rt_expression_interface<double>>
            ((viennamath *)&stack0xfffffffffffffe98,
             (rt_variable<viennamath::rt_expression_interface<double>_> *)local_88,300.0,&local_a0);
  poVar1 = std::operator<<((ostream *)&std::cout,"Expression after substitution: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_expr<viennamath::rt_expression_interface<double>_> *)
                             &stack0xfffffffffffffe98);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  x_ref = 0.0;
  Timer::start((Timer *)&elapsed);
  for (local_16c = 0; local_16c < 1000000; local_16c = local_16c + 1) {
    viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
              (&local_178,
               (rt_expr<viennamath::rt_expression_interface<double>_> *)&stack0xfffffffffffffe98);
    local_180 = 2.0;
    nVar4 = viennamath::eval<viennamath::rt_expression_interface<double>,double>
                      (&local_178,&local_180);
    x_ref = nVar4 + x_ref;
    viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_178);
  }
  result = Timer::get((Timer *)&elapsed);
  print_stats(x_ref,result);
  poVar1 = std::operator<<((ostream *)&std::cout,"--------- ViennaMath (compiletime) --------- ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"|");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"|  * (not possible in this case)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"|");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "****************************************************");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "*****     TUTORIAL COMPLETED SUCCESSFULLY!     *****");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "****************************************************");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  timer.ts._4_4_ = 0;
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&stack0xfffffffffffffe98);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_a0);
  viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::~rt_variable
            ((rt_variable<viennamath::rt_expression_interface<double>_> *)local_88);
  viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::~rt_variable
            ((rt_variable<viennamath::rt_expression_interface<double>_> *)&T.id_);
  return timer.ts._4_4_;
}

Assistant:

int main()
{
  Timer timer;
  double elapsed;
  double result = 0;
  double x_ref = 2.0;
  double T_ref = 300;
  double kb = 1.61;
  double voltage = 3.0;
  double prefactor = 2.0;
  double eps = 8.854e-12;

  double mult;

  std::cout << "**** ViennaMath performance benchmark ****" << std::endl;
  std::cout << "Make sure that optimization flags (e.g. -O2) are set when benchmarking!" << std::endl;

  //
  // First step: disable precomputations by the compiler for naive implementation
  // If not specified at runtime, compiler might detect voltage and prefactor to be constants and precompute results
  std::cout << "Enter '1': ";
  std::cin >> mult;
  voltage *= mult;
  prefactor *= mult;
  T_ref *= mult;
  kb *= mult;

  std::cout << "--------- Naive (standard) implementation --------- " << std::endl;

  //the reference implementation:
  timer.start();
  for (int i=0; i<BENCHMARK_SIZE; ++i)
    result += (T_ref * eps * x_ref * ::exp( prefactor * voltage / (kb * T_ref) ) );
  elapsed = timer.get();


  print_stats(result, elapsed);


  std::cout << "--------- Hand tuned implementation (best possible, but will never be achieved within a simulator) --------- " << std::endl;

  //the reference implementation:
  result = 0;
  timer.start();
  for (int i=0; i<BENCHMARK_SIZE; ++i)
    result += 2.6894024e-9 * x_ref;
  elapsed = timer.get();

  print_stats(result, elapsed);



  std::cout << "--------- ViennaMath (runtime) --------- " << std::endl;

  //ViennaMath:
  viennamath::variable  x(0);
  viennamath::variable  T(1);
  viennamath::expr e = (T * eps * x * viennamath::exp( prefactor * voltage / (kb * T) ) );
  std::cout << "Expression before substitution: " << e << std::endl;
  viennamath::expr e_opt = viennamath::substitute(T, 300.0, e);
  std::cout << "Expression after substitution: " << e_opt << std::endl;
  result = 0;
  timer.start();
  for (int i=0; i<BENCHMARK_SIZE; ++i)
    result += viennamath::eval(e_opt, 2.0);
  elapsed = timer.get();

  print_stats(result, elapsed);


  std::cout << "--------- ViennaMath (compiletime) --------- " << std::endl;
  std::cout << "|" << std::endl;
  std::cout << "|  * (not possible in this case)" << std::endl;
  std::cout << "|" << std::endl;

  std::cout << "****************************************************" << std::endl;
  std::cout << "*****     TUTORIAL COMPLETED SUCCESSFULLY!     *****" << std::endl;
  std::cout << "****************************************************" << std::endl;

  return EXIT_SUCCESS;
}